

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

void __thiscall
tcu::astc::anon_unknown_0::BitAssignAccessStream::setNext
          (BitAssignAccessStream *this,int num,deUint32 bits)

{
  int iVar1;
  int iVar2;
  AssignBlock128 *this_00;
  int iVar3;
  int numBits;
  int iVar4;
  deUint32 dVar5;
  deUint32 actualBits;
  int high;
  int low;
  int numBitsToDst;
  int end;
  deUint32 bits_local;
  int num_local;
  BitAssignAccessStream *this_local;
  
  if ((num != 0) && (this->m_ndx < this->m_length)) {
    iVar3 = de::min<int>(this->m_length,this->m_ndx + num);
    numBits = de::max<int>(0,iVar3 - this->m_ndx);
    iVar3 = this->m_ndx;
    iVar4 = this->m_ndx + numBits + -1;
    dVar5 = getBits(bits,0,numBits + -1);
    this->m_ndx = num + this->m_ndx;
    if ((this->m_forward & 1U) == 0) {
      this_00 = this->m_dst;
      iVar1 = this->m_startNdxInSrc;
      iVar2 = this->m_startNdxInSrc;
      dVar5 = reverseBits(dVar5,numBits);
      AssignBlock128::setBits(this_00,iVar1 - iVar4,iVar2 - iVar3,dVar5);
    }
    else {
      AssignBlock128::setBits
                (this->m_dst,this->m_startNdxInSrc + iVar3,this->m_startNdxInSrc + iVar4,dVar5);
    }
  }
  return;
}

Assistant:

void setNext (int num, deUint32 bits)
	{
		DE_ASSERT((bits & (((deUint64)1 << num) - 1)) == bits);

		if (num == 0 || m_ndx >= m_length)
			return;

		const int		end				= m_ndx + num;
		const int		numBitsToDst	= de::max(0, de::min(m_length, end) - m_ndx);
		const int		low				= m_ndx;
		const int		high			= m_ndx + numBitsToDst - 1;
		const deUint32	actualBits		= getBits(bits, 0, numBitsToDst-1);

		m_ndx += num;

		return m_forward ? m_dst.setBits(m_startNdxInSrc + low,  m_startNdxInSrc + high, actualBits)
						 : m_dst.setBits(m_startNdxInSrc - high, m_startNdxInSrc - low, reverseBits(actualBits, numBitsToDst));
	}